

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Convolution2D.cpp
# Opt level: O2

void __thiscall layer::Convolution2D::backPropagate(Convolution2D *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  tensor *pppplVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  int i;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  tensor ppplVar17;
  tensor ppplVar18;
  uint uVar19;
  ulong uVar20;
  tensor ppplVar21;
  ulong uVar22;
  long lVar23;
  int posXOut;
  ulong uVar24;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  unkbyte10 in_ST4;
  unkbyte10 in_ST5;
  unkbyte10 in_ST6;
  unkbyte10 Var25;
  undefined6 in_stack_ffffffffffffff82;
  tensor local_70;
  
  uVar9 = (this->super_Layer)._sizeZWeight;
  iVar12 = this->_sizeYIn;
  uVar10 = iVar12 * uVar9 * iVar12;
  local_70 = (this->super_Layer)._deltaIn;
  uVar15 = 0;
  uVar11 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar11 = uVar15;
  }
  for (; uVar11 * 0x10 != uVar15; uVar15 = uVar15 + 0x10) {
    *(longdouble *)((long)**local_70 + uVar15) = (longdouble)0;
    in_ST6 = in_ST5;
  }
  uVar10 = (this->super_Layer)._sizeYOut;
  ppplVar17 = (tensor)0x0;
  if (0 < (int)uVar9) {
    ppplVar17 = (tensor)(ulong)uVar9;
  }
  uVar1 = (this->super_Layer)._sizeZOut;
  uVar11 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar11 = 0;
  }
  uVar15 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar15 = 0;
  }
  ppplVar18 = ppplVar17;
  for (uVar20 = 0; uVar20 != uVar15; uVar20 = uVar20 + 1) {
    uVar10 = (this->super_Layer)._sizeXOut;
    if ((int)uVar10 < 1) {
      uVar10 = 0;
    }
    for (uVar22 = 0; uVar22 != uVar11; uVar22 = uVar22 + 1) {
      for (uVar24 = 0; uVar24 != uVar10; uVar24 = uVar24 + 1) {
        iVar2 = this->_stepY;
        iVar3 = this->_zeroPaddingY;
        uVar1 = (this->super_Layer)._sizeYWeight;
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        for (ppplVar21 = (tensor)0x0; ppplVar21 != ppplVar17;
            ppplVar21 = (tensor)((long)ppplVar21 + 1)) {
          iVar4 = this->_stepX;
          iVar5 = this->_zeroPaddingX;
          uVar6 = (this->super_Layer)._sizeXWeight;
          if ((int)uVar6 < 1) {
            uVar6 = 0;
          }
          uVar14 = iVar2 * (int)uVar22 - iVar3;
          for (uVar16 = 0; uVar16 != uVar1; uVar16 = uVar16 + 1) {
            ppplVar18 = (tensor)CONCAT71((int7)((ulong)ppplVar18 >> 8),(int)uVar14 < 0);
            if ((int)uVar14 < iVar12 && (int)uVar14 >= 0) {
              local_70 = (this->super_Layer)._deltaIn;
              ppplVar18 = (this->super_Layer)._delta;
              pppplVar7 = (this->super_Layer)._ptrWeight;
              uVar19 = iVar4 * (int)uVar24 - iVar5;
              for (lVar13 = 0; (ulong)uVar6 * 0x10 != lVar13; lVar13 = lVar13 + 0x10) {
                if ((int)uVar19 < iVar12 && -1 < (int)uVar19) {
                  local_70[(long)ppplVar21][uVar14][uVar19] =
                       local_70[(long)ppplVar21][uVar14][uVar19] +
                       *(longdouble *)((long)pppplVar7[uVar20][(long)ppplVar21][uVar16] + lVar13) *
                       ppplVar18[uVar20][uVar22][uVar24];
                  in_ST6 = in_ST5;
                }
                uVar19 = uVar19 + 1;
              }
            }
            uVar14 = uVar14 + 1;
          }
        }
      }
    }
  }
  lVar23 = 0;
  for (lVar13 = 0; lVar13 < (int)(uVar9 * iVar12 * iVar12); lVar13 = lVar13 + 1) {
    auVar8._10_6_ = in_stack_ffffffffffffff82;
    auVar8._0_10_ = *(unkbyte10 *)((long)**local_70 + lVar23);
    Var25 = in_ST6;
    (*(this->super_Layer)._fDerivative)((scalar *)ppplVar18,(scalar)auVar8);
    local_70 = (this->super_Layer)._deltaIn;
    *(unkbyte10 *)((long)**local_70 + lVar23) = in_ST0;
    uVar9 = (this->super_Layer)._sizeZWeight;
    iVar12 = this->_sizeYIn;
    lVar23 = lVar23 + 0x10;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = in_ST6;
    in_ST6 = Var25;
  }
  return;
}

Assistant:

void Convolution2D::backPropagate()
    {
        int posXIn = 0;
        int posYIn = 0;

        for(int i(0); i < _sizeZWeight * _sizeYIn * _sizeYIn; i++)
            (**_deltaIn)[i] = 0;

        for (int posZOut(0); posZOut < _sizeZOut; posZOut++) {
            for (int posYOut(0); posYOut < _sizeYOut; posYOut++) {
                for (int posXOut(0); posXOut < _sizeXOut; posXOut++) {

                    for (int posZKernel(0); posZKernel < _sizeZWeight; posZKernel++) {
                        posYIn = (posYOut * _stepY) - _zeroPaddingY;
                        for (int posYKernel(0); posYKernel < _sizeYWeight; posYKernel++) {
                            if((posYIn >= 0) & (posYIn < _sizeYIn)) {
                                posXIn = (posXOut * _stepX) - _zeroPaddingX;
                                for (int posXKernel(0); posXKernel < _sizeXWeight; posXKernel++) {
                                    if((posXIn >= 0) & (posXIn < _sizeYIn)) {
                                        _deltaIn[posZKernel][posYIn][posXIn] +=
                                                _delta[posZOut][posYOut][posXOut] *
                                                _ptrWeight[posZOut][posZKernel][posYKernel][posXKernel];
                                    }
                                    posXIn++;
                                }
                            }
                            posYIn++;
                        }
                    }
                }
            }
        }


        for(int i(0); i < _sizeZWeight * _sizeYIn * _sizeYIn; i++)
            (**_deltaIn)[i] = _fDerivative((**_deltaIn)[i]);
    }